

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int areadfloat_part(char *file,int s_coeff,int e_coeff,float **data_ref,int *length_ref)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_48 [4];
  int local_44;
  int dummy_length;
  int i;
  float *r_buf;
  uint *puStack_30;
  int r_len;
  int *length_ref_local;
  float **data_ref_local;
  int e_coeff_local;
  int s_coeff_local;
  char *file_local;
  
  puStack_30 = (uint *)length_ref;
  length_ref_local = (int *)data_ref;
  data_ref_local._0_4_ = e_coeff;
  data_ref_local._4_4_ = s_coeff;
  _e_coeff_local = file;
  if (e_coeff < s_coeff) {
    __assert_fail("s_coeff <= e_coeff",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                  ,0x215,"int areadfloat_part(char *, int, int, float **, int *)");
  }
  iVar1 = strcmp(file,areadfloat_part::p_file);
  if (iVar1 != 0) {
    if (areadfloat_part::fp != (FILE *)0x0) {
      fclose((FILE *)areadfloat_part::fp);
    }
    areadfloat_part::len = get_length(_e_coeff_local,&areadfloat_part::byterev);
    if (areadfloat_part::len < 0) {
      return -1;
    }
    areadfloat_part::fp = (FILE *)fopen(_e_coeff_local,"rb");
    if ((FILE *)areadfloat_part::fp == (FILE *)0x0) {
      fprintf(_stderr,"areadfloat_part: unable to open %s for reading;",_e_coeff_local);
      perror("");
      length_ref_local[0] = 0;
      length_ref_local[1] = 0;
      *puStack_30 = 0;
      return -1;
    }
    strcpy(areadfloat_part::p_file,_e_coeff_local);
    sVar2 = fread(local_48,4,1,(FILE *)areadfloat_part::fp);
    if (sVar2 != 1) {
      fprintf(_stderr,"areadfloat_part: unable to read length from %s;",_e_coeff_local);
      perror("");
      length_ref_local[0] = 0;
      length_ref_local[1] = 0;
      *puStack_30 = 0;
      return -1;
    }
  }
  if ((int)data_ref_local._4_4_ < areadfloat_part::len) {
    if (areadfloat_part::len <= (int)data_ref_local) {
      fprintf(_stderr,"areadfloat_part: end of data beyond end of file; resetting\n");
      data_ref_local._0_4_ = areadfloat_part::len + -1;
    }
    iVar1 = fseek((FILE *)areadfloat_part::fp,(long)(int)data_ref_local._4_4_ * 4 + 4,0);
    if (iVar1 < 0) {
      fprintf(_stderr,"areadfloat_part: seek fail;");
      perror("");
      fprintf(_stderr,"offset == %zu in %s\n",(long)(int)data_ref_local._4_4_ * 4 + 4,_e_coeff_local
             );
      length_ref_local[0] = 0;
      length_ref_local[1] = 0;
      *puStack_30 = 0;
      file_local._4_4_ = 0xffffffff;
    }
    else {
      r_buf._4_4_ = ((int)data_ref_local - data_ref_local._4_4_) + 1;
      if (areadfloat_part::len < (int)(data_ref_local._4_4_ + r_buf._4_4_)) {
        __assert_fail("s_coeff + r_len <= len",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                      ,0x250,"int areadfloat_part(char *, int, int, float **, int *)");
      }
      if (length_ref_local == (int *)0x0) {
        file_local._4_4_ = r_buf._4_4_;
        if (puStack_30 != (uint *)0x0) {
          *puStack_30 = r_buf._4_4_;
        }
      }
      else {
        _dummy_length = calloc((long)(int)r_buf._4_4_,4);
        sVar2 = fread(_dummy_length,4,(long)(int)r_buf._4_4_,(FILE *)areadfloat_part::fp);
        if (sVar2 == (long)(int)r_buf._4_4_) {
          if (areadfloat_part::byterev == 1) {
            for (local_44 = 0; local_44 < (int)r_buf._4_4_; local_44 = local_44 + 1) {
              *(uint *)((long)_dummy_length + (long)local_44 * 4) =
                   *(int *)((long)_dummy_length + (long)local_44 * 4) >> 0x18 & 0xffU |
                   *(int *)((long)_dummy_length + (long)local_44 * 4) >> 8 & 0xff00U |
                   (*(uint *)((long)_dummy_length + (long)local_44 * 4) & 0xff00) << 8 |
                   *(int *)((long)_dummy_length + (long)local_44 * 4) << 0x18;
            }
          }
          *(void **)length_ref_local = _dummy_length;
          *puStack_30 = r_buf._4_4_;
          file_local._4_4_ = r_buf._4_4_;
        }
        else {
          fprintf(_stderr,"areadfloat_part: unable to read %d coeff @ %d from %s\n",
                  (ulong)r_buf._4_4_,(ulong)data_ref_local._4_4_,_e_coeff_local);
          free(_dummy_length);
          length_ref_local[0] = 0;
          length_ref_local[1] = 0;
          *puStack_30 = 0;
          file_local._4_4_ = 0xffffffff;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"areadfloat_part: start of data beyond end of file\n");
    length_ref_local[0] = 0;
    length_ref_local[1] = 0;
    *puStack_30 = 0;
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

int
areadfloat_part (char *file,
                 int s_coeff,
                 int e_coeff,
                 float **data_ref,
                 int *length_ref)
{
    static char p_file[MAXPATHLEN] = "";
    static FILE *fp = NULL;
    static int len;
    static int byterev;
    int r_len;
    float *r_buf;
    int i;
    int dummy_length;

    assert(s_coeff <= e_coeff);
    if (strcmp(file, p_file) != 0) {
        if (fp) {
            fclose(fp);
        }
        /* Get the file length and whether the file needs to be
           byte-reversed */
        if ((len = get_length(file, &byterev)) < 0) {
            return -1;
        }
        fp = fopen(file, "rb");
        if (fp == NULL) {
            fprintf(stderr, "areadfloat_part: unable to open %s for reading;", file);
            perror("");
            *data_ref = NULL;
            *length_ref = 0;

            return -1;
        }
        strcpy(p_file, file);

        if (fread(&dummy_length, sizeof(int), 1, fp) != 1) {
            fprintf(stderr, "areadfloat_part: unable to read length from %s;", file);
            perror("");

            *data_ref = NULL;
            *length_ref = 0;

            return -1;
        }
    }

    if (s_coeff >= len) {
        fprintf(stderr, "areadfloat_part: start of data beyond end of file\n");
        *data_ref = NULL;
        *length_ref = 0;

        return 0;
    }

    if (e_coeff >= len) {
        fprintf(stderr, "areadfloat_part: end of data beyond end of file; resetting\n");

        e_coeff = len-1;
    }

    if (fseek(fp, s_coeff * sizeof(float) + sizeof(int), SEEK_SET) < 0) {
        fprintf(stderr, "areadfloat_part: seek fail;");
        perror("");
        fprintf(stderr, "offset == %zu in %s\n",
                s_coeff * sizeof(float) + sizeof(int), file);

        *data_ref = NULL;
        *length_ref = 0;
        return -1;
    }

    r_len = e_coeff - s_coeff + 1;

    assert(s_coeff + r_len <= len);
    /* Just get the file size if we were not given a buffer. */
    if (data_ref == NULL) {
        if (length_ref)
            *length_ref = r_len;
        return r_len;
    }

    r_buf = calloc(r_len, sizeof(float));
    if (fread(r_buf, sizeof(float), r_len, fp) != r_len) {
        fprintf(stderr, "areadfloat_part: unable to read %d coeff @ %d from %s\n",
                r_len, s_coeff, file);
        free(r_buf);
        *data_ref = NULL;
        *length_ref = 0;
        return -1;
    }

  if (byterev==1) 
    for (i = 0; i < r_len; i++) {
        MYSWAP_FLOAT(&r_buf[i]);
    }

    *data_ref = r_buf;
    *length_ref = r_len;

    return r_len;
}